

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void Node_Copy(node *p,node *Src,array *Dup)

{
  long *plVar1;
  nodedata *pnVar2;
  void *pvVar3;
  ulong Type;
  uint8_t Data [256];
  undefined1 local_138 [264];
  
  plVar1 = (long *)p->VMT;
  if (plVar1 == (long *)Src->VMT) {
    for (pnVar2 = Src->Data; pnVar2 != (nodedata *)0x0; pnVar2 = pnVar2->Next) {
      Type = (ulong)((uint)pnVar2->Code & 0x3f);
      if (((Type < 0x21) && ((0x188000000U >> Type & 1) != 0)) &&
         (pvVar3 = Node_AddData(p,pnVar2->Code >> 8,Type,pnVar2 + 1),
         pvVar3 != (void *)0x0 && Type == 0x1b)) {
        (**(code **)(*plVar1 + 0xb8))(p,pvVar3,Dup);
      }
    }
    CopyData((nodeclass *)(plVar1 + -9),p,Src,Dup,local_138);
  }
  return;
}

Assistant:

void Node_Copy(node* p, node* Src, array* Dup)
{
    nodedata* i;
    const nodeclass* Class = NodeGetClass(p);
    uint8_t Data[MAXDATA];

    // at moment only same ClassId will be copied
    if (Class != NodeGetClass(Src))
        return;

    for (i=Src->Data;i;i=i->Next)
    {
        datatype Type = i->Code & TYPE_MASK;
        if (Type == TYPE_EXPRSTRING || Type == TYPE_EXPRPARAM || Type == TYPE_EXPR)
        {
            nodeexpr* expr = Node_AddData(p,(dataid)(i->Code>>8),Type,NodeData_Data(i));
            if (Type == TYPE_EXPR && expr)
                NodeClass_Context(Class)->ExprDup(p,expr,Dup);
        }
    }

    CopyData(Class,p,Src,Dup,Data);
}